

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::setErrorState
          (QSocks5SocketEnginePrivate *this,Socks5State state,QString *extraMessage)

{
  SocketError SVar1;
  QString *errorString;
  QAbstractSocketEngine *in_RDX;
  Socks5State in_ESI;
  QSocks5SocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  SocketError controlSocketError;
  QSocks5SocketEngine *q;
  SocketState in_stack_fffffffffffffe5c;
  QString *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  QAbstractSocketEngine *in_stack_fffffffffffffe70;
  QString *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffea8;
  QChar fillChar;
  bool local_125;
  QChar local_ca [97];
  long local_8;
  
  fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffea8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = (QString *)q_func(in_RDI);
  switch(in_ESI) {
  case Uninitialized:
  case AuthenticationMethodsSent:
  case Authenticating:
  case RequestMethodSent:
  case Connected:
  case UdpAssociateSuccess:
  case BindSuccess:
    goto LAB_003701c9;
  case ConnectError:
  case ControlSocketError:
    SVar1 = QAbstractSocket::error((QAbstractSocket *)0x36fdc2);
    if (in_RDI->socks5State == Connected) {
      QIODevice::errorString();
      QAbstractSocketEngine::setError
                (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 in_stack_fffffffffffffe60);
      QString::~QString((QString *)0x37000e);
    }
    else {
      switch(SVar1) {
      case ConnectionRefusedError:
        QSocks5SocketEngine::tr
                  (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe5c);
        QAbstractSocketEngine::setError
                  (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                   ,in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x36fe57);
        break;
      case RemoteHostClosedError:
        QSocks5SocketEngine::tr
                  (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe5c);
        QAbstractSocketEngine::setError
                  (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                   ,in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x36feaa);
        break;
      case HostNotFoundError:
        QSocks5SocketEngine::tr
                  (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe5c);
        QAbstractSocketEngine::setError
                  (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                   ,in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x36fefd);
        break;
      default:
switchD_0036fe06_caseD_3:
        QIODevice::errorString();
        QAbstractSocketEngine::setError
                  (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                   ,in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x36ffb5);
        break;
      case SocketTimeoutError:
        if (in_ESI != ConnectError) goto switchD_0036fe06_caseD_3;
        QSocks5SocketEngine::tr
                  (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe5c);
        QAbstractSocketEngine::setError
                  (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                   ,in_stack_fffffffffffffe60);
        QString::~QString((QString *)0x36ff5a);
      }
    }
    break;
  case AuthenticatingError:
    local_125 = QString::isEmpty((QString *)0x37002d);
    if (local_125) {
      QSocks5SocketEngine::tr
                (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe5c);
      SVar1 = (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    }
    else {
      QSocks5SocketEngine::tr
                (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe5c);
      SVar1 = (SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      QChar::QChar<char16_t,_true>(local_ca,L' ');
      QString::arg<QString,_true>
                (in_stack_fffffffffffffe80,errorString,(int)((ulong)in_RDX >> 0x20),fillChar);
      in_stack_fffffffffffffe70 = in_RDX;
    }
    local_125 = !local_125;
    QAbstractSocketEngine::setError(in_stack_fffffffffffffe70,SVar1,in_stack_fffffffffffffe60);
    QString::~QString((QString *)0x3700e7);
    if (local_125) {
      QString::~QString((QString *)0x370100);
    }
    break;
  case RequestError:
    break;
  case SocksError:
    QSocks5SocketEngine::tr
              ((char *)errorString,(char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              (in_stack_fffffffffffffe70,(SocketError)((ulong)errorString >> 0x20),
               in_stack_fffffffffffffe60);
    QString::~QString((QString *)0x370158);
    break;
  case HostNameLookupError:
    QAbstractSocket::tr(in_stack_fffffffffffffe68,(char *)errorString,in_stack_fffffffffffffe5c);
    QAbstractSocketEngine::setError
              (in_stack_fffffffffffffe70,(SocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               errorString);
    QString::~QString((QString *)0x3701a8);
    in_stack_fffffffffffffe60 = errorString;
  }
  QAbstractSocketEngine::setState
            ((QAbstractSocketEngine *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  in_RDI->socks5State = in_ESI;
LAB_003701c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::setErrorState(Socks5State state, const QString &extraMessage)
{
    Q_Q(QSocks5SocketEngine);

    switch (state) {
    case Uninitialized:
    case Authenticating:
    case AuthenticationMethodsSent:
    case RequestMethodSent:
    case Connected:
    case UdpAssociateSuccess:
    case BindSuccess:
        // these aren't error states
        return;

    case ConnectError:
    case ControlSocketError: {
        QAbstractSocket::SocketError controlSocketError = data->controlSocket->error();
        if (socks5State != Connected) {
            switch (controlSocketError) {
            case QAbstractSocket::ConnectionRefusedError:
                q->setError(QAbstractSocket::ProxyConnectionRefusedError,
                             QSocks5SocketEngine::tr("Connection to proxy refused"));
                break;
            case QAbstractSocket::RemoteHostClosedError:
                q->setError(QAbstractSocket::ProxyConnectionClosedError,
                             QSocks5SocketEngine::tr("Connection to proxy closed prematurely"));
                break;
            case QAbstractSocket::HostNotFoundError:
                q->setError(QAbstractSocket::ProxyNotFoundError,
                             QSocks5SocketEngine::tr("Proxy host not found"));
                break;
            case QAbstractSocket::SocketTimeoutError:
                if (state == ConnectError) {
                    q->setError(QAbstractSocket::ProxyConnectionTimeoutError,
                                 QSocks5SocketEngine::tr("Connection to proxy timed out"));
                    break;
                }
                Q_FALLTHROUGH();
            default:
                q->setError(controlSocketError, data->controlSocket->errorString());
                break;
            }
        } else {
            q->setError(controlSocketError, data->controlSocket->errorString());
        }
        break;
    }

    case AuthenticatingError:
        q->setError(QAbstractSocket::ProxyAuthenticationRequiredError,
                    extraMessage.isEmpty() ?
                     QSocks5SocketEngine::tr("Proxy authentication failed") :
                     QSocks5SocketEngine::tr("Proxy authentication failed: %1").arg(extraMessage));
        break;

    case RequestError:
        // error code set by caller (overload)
        break;

    case SocksError:
        q->setError(QAbstractSocket::ProxyProtocolError,
                     QSocks5SocketEngine::tr("SOCKS version 5 protocol error"));
        break;

    case HostNameLookupError:
        q->setError(QAbstractSocket::HostNotFoundError,
                    QAbstractSocket::tr("Host not found"));
        break;
    }

    q->setState(QAbstractSocket::UnconnectedState);
    socks5State = state;
}